

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_layer.cpp
# Opt level: O1

void __thiscall neural_networks::utilities::NeuralLayer::print(NeuralLayer *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nData Vector: ",0xe);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  (*(this->data->super_Matrix<neural_networks::utilities::Neuron_*>)._vptr_Matrix[5])();
  if (this->bias != (Matrix<long_double> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nWeight Matrix: ",0x10);
    poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
    (*this->weights->_vptr_Matrix[5])();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nBias Vector: ",0xe);
    poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
    (*this->bias->_vptr_Matrix[5])();
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return;
}

Assistant:

void NeuralLayer::print() const {
    std::cout << "\nData Vector: " << data << "\n\n";
    data -> print();
    if(bias) {
        std::cout << "\nWeight Matrix: " << weights << "\n\n";
        weights -> print();
        std::cout << "\nBias Vector: " << bias << "\n\n";
        bias -> print();
    }
    std::cout << std::endl;
}